

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadLane<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  uchar *puVar2;
  uchar local_31;
  undefined1 auStack_30 [7];
  T val;
  Simd<unsigned_char,_(unsigned_char)__x10_> result;
  Ptr *out_trap_local;
  Thread *this_local;
  
  result.v._8_8_ = out_trap;
  _auStack_30 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  RVar1 = Load<unsigned_char>(this,instr,&local_31,(Ptr *)result.v._8_8_);
  if (RVar1 == Ok) {
    puVar2 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<unsigned_char,_(unsigned_char)__x10_> *)auStack_30,
                        instr.field_2.imm_u32x2_u8.idx);
    *puVar2 = local_31;
    Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,_auStack_30);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadLane(Instr instr, Trap::Ptr* out_trap) {
  using T = typename S::LaneType;
  auto result = Pop<S>();
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  result[instr.imm_u32x2_u8.idx] = val;
  Push(result);
  return RunResult::Ok;
}